

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::TestResult::ValidateTestProperty(string *xml_element,TestProperty *test_property)

{
  ostream *poVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  pointer pbVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  ulong uVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  size_t i;
  ulong uVar8;
  allocator local_c1;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  ostream *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  string local_70 [32];
  string local_50;
  
  std::__cxx11::string::string(local_70,(test_property->key_)._M_dataplus._M_p,&local_c1);
  GetReservedAttributesForElement(&local_a8,xml_element);
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,local_70);
  pbVar3 = local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar7 = local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var4._M_current !=
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Message::Message((Message *)&local_90);
    local_b0 = local_90._M_head_impl;
    poVar1 = (ostream *)(local_90._M_head_impl + 0x10);
    std::operator<<(poVar1,"Reserved key used in RecordProperty(): ");
    std::operator<<(poVar1,local_70);
    std::operator<<(poVar1," (");
    local_80 = pbVar3;
    local_88 = poVar1;
    local_78 = _Var4._M_current;
    Message::Message((Message *)&local_c0);
    local_b8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_c0._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    poVar1 = (ostream *)
             ((long)local_c0._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x10);
    lVar6 = 0;
    for (uVar8 = 0; _Var2._M_head_impl = local_b8._M_head_impl,
        uVar5 = (long)local_a8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_a8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5, uVar8 < uVar5;
        uVar8 = uVar8 + 1) {
      if ((uVar8 != 0) && (2 < uVar5)) {
        std::operator<<(poVar1,", ");
        uVar5 = (long)local_a8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_a8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
      }
      if (uVar8 == uVar5 - 1) {
        std::operator<<(poVar1,"and ");
      }
      std::operator<<(poVar1,"\'");
      std::operator<<(poVar1,(string *)
                             ((long)&((local_a8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar6));
      std::operator<<(poVar1,"\'");
      lVar6 = lVar6 + 0x20;
    }
    internal::StringStreamToString(&local_50,local_b8._M_head_impl);
    _Var4._M_current = local_78;
    pbVar7 = local_80;
    poVar1 = local_88;
    if (_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))(_Var2._M_head_impl);
    }
    std::operator<<(poVar1,(string *)&local_50);
    std::operator<<(poVar1," are reserved by ");
    std::operator<<(poVar1,"Google Test");
    std::operator<<(poVar1,")");
    internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sneivandt[P]chess/extern/googletest/googletest/src/gtest.cc"
               ,0x86d,"Failed");
    internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_90);
    internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    std::__cxx11::string::~string((string *)&local_50);
    if (local_b0 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      (**(code **)(*(long *)local_b0 + 8))();
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  std::__cxx11::string::~string(local_70);
  return _Var4._M_current == pbVar7;
}

Assistant:

bool TestResult::ValidateTestProperty(const std::string& xml_element,
                                      const TestProperty& test_property) {
  return ValidateTestPropertyName(test_property.key(),
                                  GetReservedAttributesForElement(xml_element));
}